

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t intersect_uint16_cardinality(uint16_t *A,size_t lenA,uint16_t *B,size_t lenB)

{
  uint16_t *endB;
  uint16_t *endA;
  int32_t answer;
  size_t lenB_local;
  uint16_t *B_local;
  size_t lenA_local;
  uint16_t *A_local;
  
  endA._4_4_ = 0;
  if ((lenA == 0) || (lenB == 0)) {
    A_local._4_4_ = 0;
  }
  else {
    lenB_local = (size_t)B;
    lenA_local = (size_t)A;
    do {
      while (*(ushort *)lenB_local <= *(ushort *)lenA_local) {
        while (*(ushort *)lenB_local < *(ushort *)lenA_local) {
          lenB_local = lenB_local + 2;
          if ((uint16_t *)lenB_local == B + lenB) {
            return endA._4_4_;
          }
        }
        if (*(short *)lenA_local != *(short *)lenB_local) break;
        endA._4_4_ = endA._4_4_ + 1;
        lenA_local = lenA_local + 2;
        if ((uint16_t *)lenA_local == A + lenA) {
          return endA._4_4_;
        }
        lenB_local = lenB_local + 2;
        if ((uint16_t *)lenB_local == B + lenB) {
          return endA._4_4_;
        }
      }
      lenA_local = lenA_local + 2;
    } while ((uint16_t *)lenA_local != A + lenA);
    A_local._4_4_ = endA._4_4_;
  }
  return A_local._4_4_;
}

Assistant:

int32_t intersect_uint16_cardinality(const uint16_t *A, const size_t lenA,
                                     const uint16_t *B, const size_t lenB) {
    int32_t answer = 0;
    if (lenA == 0 || lenB == 0) return 0;
    const uint16_t *endA = A + lenA;
    const uint16_t *endB = B + lenB;

    while (1) {
        while (*A < *B) {
        SKIP_FIRST_COMPARE:
            if (++A == endA) return answer;
        }
        while (*A > *B) {
            if (++B == endB) return answer;
        }
        if (*A == *B) {
            ++answer;
            if (++A == endA || ++B == endB) return answer;
        } else {
            goto SKIP_FIRST_COMPARE;
        }
    }
    return answer;  // NOTREACHED
}